

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridWavelet.cpp
# Opt level: O0

void __thiscall
TasGrid::GridWavelet::getDifferentiationWeights(GridWavelet *this,double *x,double *weights)

{
  value_type vVar1;
  AccelerationContext *acceleration;
  bool bVar2;
  int iVar3;
  int *p;
  size_type __n;
  reference pvVar4;
  double *b;
  MultiIndexSet *local_78;
  int local_68;
  int local_64;
  int i_2;
  int i_1;
  int d;
  allocator<double> local_49;
  undefined1 local_48 [8];
  vector<double,_std::allocator<double>_> local_weights;
  int i;
  int num_points;
  MultiIndexSet *work;
  double *weights_local;
  double *x_local;
  GridWavelet *this_local;
  
  bVar2 = MultiIndexSet::empty(&(this->super_BaseCanonicalGrid).points);
  if (bVar2) {
    local_78 = &(this->super_BaseCanonicalGrid).needed;
  }
  else {
    local_78 = &(this->super_BaseCanonicalGrid).points;
  }
  local_weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = MultiIndexSet::getNumIndexes(local_78);
  for (local_weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
      (int)local_weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage <
      local_weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_;
      local_weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ =
           (int)local_weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage + 1) {
    p = MultiIndexSet::getIndex
                  (local_78,(int)local_weights.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage);
    evalDiffBasis(this,p,x,weights + (int)local_weights.
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage *
                                     (this->super_BaseCanonicalGrid).num_dimensions);
  }
  iVar3 = TasSparse::WaveletBasisMatrix::getNumRows(&this->inter_matrix);
  if (iVar3 != local_weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_) {
    buildInterpolationMatrix(this);
  }
  __n = (size_type)
        local_weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_;
  ::std::allocator<double>::allocator(&local_49);
  ::std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_48,__n,&local_49);
  ::std::allocator<double>::~allocator(&local_49);
  for (i_2 = 0; i_2 < (this->super_BaseCanonicalGrid).num_dimensions; i_2 = i_2 + 1) {
    for (local_64 = 0;
        local_64 <
        local_weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_; local_64 = local_64 + 1) {
      vVar1 = weights[local_64 * (this->super_BaseCanonicalGrid).num_dimensions + i_2];
      pvVar4 = ::std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_48,(long)local_64);
      *pvVar4 = vVar1;
    }
    acceleration = (this->super_BaseCanonicalGrid).acceleration;
    b = ::std::vector<double,_std::allocator<double>_>::data
                  ((vector<double,_std::allocator<double>_> *)local_48);
    TasSparse::WaveletBasisMatrix::invertTransposed(&this->inter_matrix,acceleration,b);
    for (local_68 = 0;
        local_68 <
        local_weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_; local_68 = local_68 + 1) {
      pvVar4 = ::std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_48,(long)local_68);
      weights[local_68 * (this->super_BaseCanonicalGrid).num_dimensions + i_2] = *pvVar4;
    }
  }
  ::std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_48);
  return;
}

Assistant:

void GridWavelet::getDifferentiationWeights(const double x[], double weights[]) const {
    const MultiIndexSet &work = (points.empty()) ? needed : points;
    int num_points = work.getNumIndexes();
    #pragma omp parallel for
    for (int i=0; i<num_points; i++) {
        evalDiffBasis(work.getIndex(i), x, &(weights[i * num_dimensions]));
    }
    if (inter_matrix.getNumRows() != num_points) buildInterpolationMatrix();
    // Solve the linear wavelet system for each direction/partial derivative and re-index.
    std::vector<double> local_weights(num_points);
    for (int d=0; d<num_dimensions; d++) {
        for (int i=0; i<num_points; i++)
            local_weights[i] = weights[i * num_dimensions + d];
        inter_matrix.invertTransposed(acceleration, local_weights.data());
        for (int i=0; i<num_points; i++)
            weights[i * num_dimensions + d] = local_weights[i];
    }
}